

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDConstructGridGlobal.cpp
# Opt level: O0

void __thiscall
TasGrid::DynamicConstructorDataGlobal::write<true>(DynamicConstructorDataGlobal *this,ostream *os)

{
  TensorData *pTVar1;
  pointer os_00;
  bool bVar2;
  size_type sVar3;
  reference ppTVar4;
  TensorData *d;
  iterator __end2;
  iterator __begin2;
  vector<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_> *__range2;
  undefined1 local_30 [8];
  vector<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_> tensor_refs;
  ostream *os_local;
  DynamicConstructorDataGlobal *this_local;
  
  tensor_refs.
  super__Vector_base<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)os;
  makeReverseReferenceVector<TasGrid::TensorData>
            ((vector<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_> *)
             local_30,&this->tensors);
  os_00 = tensor_refs.
          super__Vector_base<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  sVar3 = ::std::vector<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_>::
          size((vector<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_> *)
               local_30);
  IO::writeNumbers<true,(TasGrid::IO::IOPad)3,int>((ostream *)os_00,(int)sVar3);
  __end2 = ::std::vector<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_>
           ::begin((vector<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_>
                    *)local_30);
  d = (TensorData *)
      ::std::vector<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_>::end
                ((vector<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_>
                  *)local_30);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_TasGrid::TensorData_**,_std::vector<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_>_>
                                *)&d);
    if (!bVar2) break;
    ppTVar4 = __gnu_cxx::
              __normal_iterator<const_TasGrid::TensorData_**,_std::vector<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_>_>
              ::operator*(&__end2);
    pTVar1 = *ppTVar4;
    IO::writeNumbers<true,(TasGrid::IO::IOPad)1,double>
              ((ostream *)
               tensor_refs.
               super__Vector_base<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,pTVar1->weight);
    IO::writeVector<true,(TasGrid::IO::IOPad)3,int>
              (&pTVar1->tensor,
               (ostream *)
               tensor_refs.
               super__Vector_base<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<const_TasGrid::TensorData_**,_std::vector<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_>_>
    ::operator++(&__end2);
  }
  writeNodeDataList<true>
            (&this->data,
             (ostream *)
             tensor_refs.
             super__Vector_base<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_>::~vector
            ((vector<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_> *)
             local_30);
  return;
}

Assistant:

void DynamicConstructorDataGlobal::write(std::ostream &os) const{
    if (use_ascii == mode_ascii){ os << std::scientific; os.precision(17); }
    auto tensor_refs =  makeReverseReferenceVector(tensors);

    IO::writeNumbers<use_ascii, IO::pad_line, int>(os, static_cast<int>(tensor_refs.size()));
    for(auto d : tensor_refs){
        IO::writeNumbers<use_ascii, IO::pad_rspace, double>(os, d->weight);
        IO::writeVector<use_ascii, IO::pad_line>(d->tensor, os);
    }
    writeNodeDataList<use_ascii>(data, os);
}